

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry
          (RTPUDPv6Transmitter *this,in6_addr ip,uint16_t port)

{
  list<unsigned_short,_std::allocator<unsigned_short>_> *plVar1;
  size_t *psVar2;
  PortInfo *pPVar3;
  _List_node_base *p_Var4;
  HashElement *pHVar5;
  undefined1 auVar6 [16];
  uint8_t local_28;
  uint8_t uStack_27;
  uint8_t uStack_26;
  uint8_t uStack_25;
  uint8_t uStack_24;
  uint8_t uStack_23;
  uint8_t uStack_22;
  uint8_t uStack_21;
  uint8_t uStack_20;
  uint8_t uStack_1f;
  uint8_t uStack_1e;
  uint8_t uStack_1d;
  uint8_t uStack_1c;
  uint8_t uStack_1b;
  uint8_t uStack_1a;
  
  pHVar5 = (this->acceptignoreinfo).table
           [((uint)ip.__in6_u._15_1_ |
            ip.__in6_u._12_4_ >> 8 & 0xff00 |
            ip.__in6_u._11_4_ & 0xff0000 | ip.__in6_u._9_4_ & 0xff000000) % 0x207d];
  (this->acceptignoreinfo).curhashelem = pHVar5;
  while( true ) {
    if (pHVar5 == (HashElement *)0x0) {
      return -0x6f;
    }
    local_28 = ip.__in6_u._0_1_;
    uStack_27 = ip.__in6_u._1_1_;
    uStack_26 = ip.__in6_u._2_1_;
    uStack_25 = ip.__in6_u._3_1_;
    uStack_24 = ip.__in6_u._4_1_;
    uStack_23 = ip.__in6_u._5_1_;
    uStack_22 = ip.__in6_u._6_1_;
    uStack_21 = ip.__in6_u._7_1_;
    uStack_20 = ip.__in6_u._8_1_;
    uStack_1f = ip.__in6_u._9_1_;
    uStack_1e = ip.__in6_u._10_1_;
    uStack_1d = ip.__in6_u._11_1_;
    uStack_1c = ip.__in6_u._12_1_;
    uStack_1b = ip.__in6_u._13_1_;
    uStack_1a = ip.__in6_u._14_1_;
    auVar6[0] = -(local_28 == (pHVar5->key).__in6_u.__u6_addr8[0]);
    auVar6[1] = -(uStack_27 == (pHVar5->key).__in6_u.__u6_addr8[1]);
    auVar6[2] = -(uStack_26 == (pHVar5->key).__in6_u.__u6_addr8[2]);
    auVar6[3] = -(uStack_25 == (pHVar5->key).__in6_u.__u6_addr8[3]);
    auVar6[4] = -(uStack_24 == (pHVar5->key).__in6_u.__u6_addr8[4]);
    auVar6[5] = -(uStack_23 == (pHVar5->key).__in6_u.__u6_addr8[5]);
    auVar6[6] = -(uStack_22 == (pHVar5->key).__in6_u.__u6_addr8[6]);
    auVar6[7] = -(uStack_21 == (pHVar5->key).__in6_u.__u6_addr8[7]);
    auVar6[8] = -(uStack_20 == (pHVar5->key).__in6_u.__u6_addr8[8]);
    auVar6[9] = -(uStack_1f == (pHVar5->key).__in6_u.__u6_addr8[9]);
    auVar6[10] = -(uStack_1e == (pHVar5->key).__in6_u.__u6_addr8[10]);
    auVar6[0xb] = -(uStack_1d == (pHVar5->key).__in6_u.__u6_addr8[0xb]);
    auVar6[0xc] = -(uStack_1c == (pHVar5->key).__in6_u.__u6_addr8[0xc]);
    auVar6[0xd] = -(uStack_1b == (pHVar5->key).__in6_u.__u6_addr8[0xd]);
    auVar6[0xe] = -(uStack_1a == (pHVar5->key).__in6_u.__u6_addr8[0xe]);
    auVar6[0xf] = -(ip.__in6_u._15_1_ == (pHVar5->key).__in6_u.__u6_addr8[0xf]);
    if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) | (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe | (ushort)(auVar6[0xf] >> 7) << 0xf)
        == 0xffff) break;
    pHVar5 = pHVar5->hashnext;
    (this->acceptignoreinfo).curhashelem = pHVar5;
  }
  pPVar3 = pHVar5->element;
  if (port == 0) {
    pPVar3->all = false;
    std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::clear(&pPVar3->portlist);
  }
  else {
    plVar1 = &pPVar3->portlist;
    p_Var4 = (_List_node_base *)plVar1;
    if (pPVar3->all == false) {
      do {
        p_Var4 = (((_List_base<unsigned_short,_std::allocator<unsigned_short>_> *)&p_Var4->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next;
        if (p_Var4 == (_List_node_base *)plVar1) {
          return -0x6f;
        }
      } while (*(uint16_t *)&p_Var4[1]._M_next != port);
      psVar2 = &(pPVar3->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var4,0x18);
    }
    else {
      for (p_Var4 = (plVar1->super__List_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl._M_node.super__List_node_base._M_next;
          p_Var4 != (_List_node_base *)plVar1; p_Var4 = p_Var4->_M_next) {
        if (*(uint16_t *)&p_Var4[1]._M_next == port) {
          return -0x6f;
        }
      }
      p_Var4 = (_List_node_base *)operator_new(0x18);
      *(uint16_t *)&p_Var4[1]._M_next = port;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      psVar2 = &(pPVar3->portlist).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>
                ._M_impl._M_node._M_size;
      *psVar2 = *psVar2 + 1;
    }
  }
  return 0;
}

Assistant:

int RTPUDPv6Transmitter::ProcessDeleteAcceptIgnoreEntry(in6_addr ip,uint16_t port)
{
	acceptignoreinfo.GotoElement(ip);
	if (!acceptignoreinfo.HasCurrentElement())
		return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
	
	PortInfo *inf;

	inf = acceptignoreinfo.GetCurrentElement();
	if (port == 0) // delete all entries
	{
		inf->all = false;
		inf->portlist.clear();
	}
	else // a specific port was selected
	{
		if (inf->all) // currently, all ports are selected. Add the one to remove to the list
		{
			// we have to check if the list doesn't contain the port already
			std::list<uint16_t>::const_iterator it,begin,end;

			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; it++)
			{
				if (*it == port) // already in list: this means we already deleted the entry
					return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;
			}
			inf->portlist.push_front(port);
		}
		else // check if we can find the port in the list
		{
			std::list<uint16_t>::iterator it,begin,end;
			
			begin = inf->portlist.begin();
			end = inf->portlist.end();
			for (it = begin ; it != end ; ++it)
			{
				if (*it == port) // found it!
				{
					inf->portlist.erase(it);
					return 0;
				}
			}
			// didn't find it
			return ERR_RTP_UDPV6TRANS_NOSUCHENTRY;			
		}
	}
	return 0;
}